

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

node_t_conflict par_type_name(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  node_t_conflict pnVar2;
  char *expected_name;
  int token_code;
  parse_ctx_t parse_ctx;
  
  ppVar1 = c2m_ctx->parse_ctx;
  if (*(short *)ppVar1->curr_token == 0x28) {
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    pnVar2 = type_name(c2m_ctx,no_err_p);
    if (pnVar2 == &err_struct) {
      return &err_struct;
    }
    if (*(short *)c2m_ctx->parse_ctx->curr_token == 0x29) {
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      return pnVar2;
    }
    if (ppVar1->record_level != 0) {
      return &err_struct;
    }
    token_code = 0x29;
  }
  else {
    if (ppVar1->record_level != 0) {
      return &err_struct;
    }
    token_code = 0x28;
  }
  expected_name = get_token_name(c2m_ctx,token_code);
  syntax_error(c2m_ctx,expected_name);
  return &err_struct;
}

Assistant:

D (par_type_name) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t r;

  PT ('(');
  P (type_name);
  PT (')');
  return r;
}